

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapcoder.c
# Opt level: O2

MapcodeError
decodeExtension(DecodeRec *dec,int dividerx4,int dividery,int lon_offset4,int extremeLat32,
               int maxLon32)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  uint uVar4;
  size_t sVar5;
  uint uVar6;
  MapcodeError MVar7;
  byte *__s;
  int iVar8;
  int iVar9;
  uint uVar10;
  MapcodeZone *pMVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  
  __s = (byte *)dec->extension;
  sVar5 = strlen((char *)__s);
  if (8 < sVar5) {
    return ERR_EXTENSION_INVALID_LENGTH;
  }
  uVar10 = 1;
  iVar9 = 0;
  iVar8 = 0;
  bVar3 = false;
  while ((ulong)*__s != 0) {
    bVar1 = decodeChar_decode_chars[*__s];
    if ((char)bVar1 < '\0') {
      return ERR_EXTENSION_INVALID_CHARACTER;
    }
    if (bVar1 == 0x1e) {
      return ERR_EXTENSION_INVALID_CHARACTER;
    }
    bVar2 = __s[1];
    if ((ulong)bVar2 == 0) {
      __s = __s + 1;
      uVar6 = 0;
      bVar3 = true;
      uVar4 = 0;
    }
    else {
      if ((bVar2 & 0xdf) == 0x5a) {
        return ERR_EXTENSION_INVALID_CHARACTER;
      }
      bVar2 = decodeChar_decode_chars[bVar2];
      if ((char)bVar2 < '\0') {
        return ERR_EXTENSION_INVALID_CHARACTER;
      }
      __s = __s + 2;
      uVar6 = (uint)(bVar2 % 6);
      uVar4 = (uint)(bVar2 / 6);
    }
    uVar10 = uVar10 * 0x1e;
    iVar9 = (uint)(bVar1 % 5) * 6 + iVar9 * 0x1e + uVar6;
    iVar8 = (uint)(byte)(bVar1 - bVar1 % 5) + iVar8 * 0x1e + uVar4;
  }
  for (; uVar10 < 810000; uVar10 = uVar10 * 0x1e) {
    dividerx4 = dividerx4 * 0x1e;
    dividery = dividery * 0x1e;
  }
  dVar13 = (double)dividerx4;
  dVar12 = (double)iVar9 * dVar13;
  dVar14 = (double)dividery;
  dVar16 = (double)iVar8 * dVar14;
  if (bVar3) {
    dVar14 = (double)(dividery * 5);
    dVar13 = (double)(dividerx4 * 6);
  }
  dVar16 = (double)(dec->coord32).latMicroDeg * 810000.0 + dVar16;
  dVar12 = (double)lon_offset4 * 810000.0 +
           (double)((dec->coord32).lonMicroDeg << 2) * 810000.0 + dVar12;
  if (dividery < 0) {
    dVar15 = dVar16 + 1.0;
    dVar16 = dVar14 + dVar15;
  }
  else {
    dVar15 = dVar14 + dVar16;
  }
  dVar13 = dVar13 + dVar12;
  (dec->zone).fminx = dVar12;
  (dec->zone).fmaxx = dVar13;
  (dec->zone).fminy = dVar16;
  (dec->zone).fmaxy = dVar15;
  if ((double)maxLon32 * 3240000.0 < dVar13) {
    (dec->zone).fmaxx = (double)maxLon32 * 3240000.0;
  }
  dVar12 = (double)extremeLat32 * 810000.0;
  if (dividery < 0) {
    pMVar11 = &dec->zone;
    if (dVar12 <= dVar16) goto LAB_0016cbd7;
  }
  else {
    if (dVar15 <= dVar12) goto LAB_0016cbd7;
    pMVar11 = (MapcodeZone *)&(dec->zone).fmaxy;
  }
  pMVar11->fminy = dVar12;
LAB_0016cbd7:
  iVar8 = isEmpty(&dec->zone);
  MVar7 = ERR_EXTENSION_UNDECODABLE;
  if (iVar8 == 0) {
    MVar7 = ERR_OK;
  }
  return MVar7;
}

Assistant:

static enum MapcodeError decodeExtension(DecodeRec *dec,
                                         int dividerx4, int dividery,
                                         const int lon_offset4,
                                         const int extremeLat32, const int maxLon32) {
    double lat1, lon4;
    const char *extrapostfix = dec->extension;
    int lon32 = 0;
    int lat32 = 0;
    int processor = 1;
    int odd = 0;
    ASSERT(dec);
    if (strlen(extrapostfix) > MAX_PRECISION_DIGITS) {
        return ERR_EXTENSION_INVALID_LENGTH;
    }
    while (*extrapostfix) {
        int column1, row1, column2, row2;
        const int c1 = decodeChar(*extrapostfix++);
        if (c1 < 0 || c1 == 30) {
            return ERR_EXTENSION_INVALID_CHARACTER;
        } // illegal extension character
        row1 = (c1 / 5);
        column1 = (c1 % 5);
        if (*extrapostfix) {
            const int c2 = decodeChar(*extrapostfix++);
            if (c2 < 0 || c2 == 30) {
                return ERR_EXTENSION_INVALID_CHARACTER;
            } // illegal extension character
            row2 = (c2 / 6);
            column2 = (c2 % 6);
        } else {
            odd = 1;
            row2 = 0;
            column2 = 0;
        }

        processor *= 30;
        lon32 = lon32 * 30 + column1 * 6 + column2;
        lat32 = lat32 * 30 + row1 * 5 + row2;
    }

    while (processor < MAX_PRECISION_FACTOR) {
        dividerx4 *= 30;
        dividery *= 30;
        processor *= 30;
    }

    lon4 = (dec->coord32.lonMicroDeg * 4 * (double) MAX_PRECISION_FACTOR) + ((lon32 * (double) dividerx4)) +
           (lon_offset4 * (double) MAX_PRECISION_FACTOR);
    lat1 = (dec->coord32.latMicroDeg * (double) MAX_PRECISION_FACTOR) + ((lat32 * (double) dividery));

    // determine the range of coordinates that are encoded to this mapcode
    if (odd) {
        setFromFractions(&dec->zone, lat1, lon4, 5 * dividery, 6 * dividerx4);
    } else {
        setFromFractions(&dec->zone, lat1, lon4, dividery, dividerx4);
    }

    // restrict the coordinate range to the extremes that were provided
    if (dec->zone.fmaxx > maxLon32 * MICROLON_TO_FRACTIONS_FACTOR) {
        dec->zone.fmaxx = maxLon32 * MICROLON_TO_FRACTIONS_FACTOR;
    }
    if (dividery >= 0) {
        if (dec->zone.fmaxy > extremeLat32 * MICROLAT_TO_FRACTIONS_FACTOR) {
            dec->zone.fmaxy = extremeLat32 * MICROLAT_TO_FRACTIONS_FACTOR;
        }
    } else {
        if (dec->zone.fminy < extremeLat32 * MICROLAT_TO_FRACTIONS_FACTOR) {
            dec->zone.fminy = extremeLat32 * MICROLAT_TO_FRACTIONS_FACTOR;
        }
    }
    if (isEmpty(&dec->zone)) {
        return ERR_EXTENSION_UNDECODABLE;
    }
    return ERR_OK;
}